

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_BloodSplatter(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  byte *pbVar1;
  PalEntry kind;
  int iVar2;
  PClassActor *type;
  AActor *pAVar3;
  uint uVar4;
  DAngle local_38;
  
  kind = AActor::GetBloodColor(originator);
  type = AActor::GetBloodType(originator,1);
  uVar4 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar4 = (*(int *)((type->super_PClass).Defaults + 0x198) << 4) >> 0x1f & cl_bloodtype.Value;
    pAVar3 = Spawn(type,pos,NO_REPLACE);
    (pAVar3->target).field_0.p = originator;
    iVar2 = FRandom::Random2(&pr_splatter);
    (pAVar3->Vel).X = (double)iVar2 * 0.015625;
    iVar2 = FRandom::Random2(&pr_splatter);
    (pAVar3->Vel).Y = (double)iVar2 * 0.015625;
    (pAVar3->Vel).Z = 3.0;
    if ((kind.field_0 != 0) && (((pAVar3->flags2).Value & 0x10000) == 0)) {
      pAVar3->Translation = (uint)kind.field_0 >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar4) {
      pbVar1 = (byte *)((long)&(pAVar3->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_004c26d3;
    }
  }
  if ((int)uVar4 < 1) {
    return;
  }
LAB_004c26d3:
  local_38.Degrees = hitangle->Degrees + -180.0;
  P_DrawSplash2(0x28,pos,&local_38,2,(int)kind.field_0);
  return;
}

Assistant:

void P_BloodSplatter (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(1); 

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *mo;

		mo = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;
		mo->Vel.X = pr_splatter.Random2 () / 64.;
		mo->Vel.Y = pr_splatter.Random2() / 64.;
		mo->Vel.Z = 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(mo->flags2 & MF2_DONTTRANSLATE)) 
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2 (40, pos, hitangle-180., 2, bloodcolor);
	}
}